

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void google::protobuf::internal::MapFieldPrinterHelper::CopyValue
               (MapValueRef *value,Message *message,FieldDescriptor *field_desc)

{
  CppType CVar1;
  int iVar2;
  Message *pMVar3;
  undefined4 extraout_var;
  string *psVar4;
  Reflection *in_RDX;
  DescriptorPool *in_RSI;
  Message *sub_message;
  Reflection *reflection;
  Message *in_stack_fffffffffffffec0;
  FieldDescriptor *in_stack_fffffffffffffec8;
  FieldDescriptor *in_stack_fffffffffffffed0;
  Reflection *pRVar5;
  Message *in_stack_fffffffffffffed8;
  Reflection *in_stack_fffffffffffffee0;
  Reflection *value_00;
  MapValueRef *in_stack_ffffffffffffff50;
  undefined1 local_48 [40];
  Reflection *local_20;
  Reflection *local_18;
  DescriptorPool *local_10;
  MapValueRef *this;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Message::GetReflection(in_stack_fffffffffffffec0);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x70cae1);
  switch(CVar1) {
  case CPPTYPE_INT32:
    MapValueRef::GetInt32Value(in_stack_ffffffffffffff50);
    Reflection::SetInt32
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (int32)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    break;
  case CPPTYPE_INT64:
    MapValueRef::GetInt64Value(in_stack_ffffffffffffff50);
    Reflection::SetInt64
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (int64)in_stack_fffffffffffffec8);
    break;
  case CPPTYPE_UINT32:
    pRVar5 = local_20;
    MapValueRef::GetUInt32Value(in_stack_ffffffffffffff50);
    Reflection::SetUInt32
              (local_18,(Message *)local_10,(FieldDescriptor *)pRVar5,
               (uint32)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    break;
  case CPPTYPE_UINT64:
    MapValueRef::GetUInt64Value(in_stack_ffffffffffffff50);
    Reflection::SetUInt64
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (uint64)in_stack_fffffffffffffec8);
    break;
  case CPPTYPE_DOUBLE:
    MapValueRef::GetDoubleValue(in_stack_ffffffffffffff50);
    Reflection::SetDouble
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (double)in_stack_fffffffffffffec8);
    break;
  case CPPTYPE_FLOAT:
    MapValueRef::GetFloatValue(in_stack_ffffffffffffff50);
    Reflection::SetFloat
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (float)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    break;
  case CPPTYPE_BOOL:
    MapValueRef::GetBoolValue(in_stack_ffffffffffffff50);
    Reflection::SetBool(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed0,SUB81((ulong)local_18 >> 0x38,0));
    break;
  case CPPTYPE_ENUM:
    MapValueRef::GetEnumValue(in_stack_ffffffffffffff50);
    Reflection::SetEnumValue
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    break;
  case CPPTYPE_STRING:
    value_00 = local_20;
    psVar4 = MapValueRef::GetStringValue_abi_cxx11_(in_stack_ffffffffffffff50);
    pRVar5 = (Reflection *)local_48;
    std::__cxx11::string::string((string *)pRVar5,(string *)psVar4);
    Reflection::SetString(pRVar5,(Message *)local_18,(FieldDescriptor *)local_10,(string *)value_00)
    ;
    std::__cxx11::string::~string((string *)local_48);
    break;
  case CPPTYPE_MESSAGE:
    pMVar3 = MapValueRef::GetMessageValue(in_stack_ffffffffffffff50);
    iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])();
    this = (MapValueRef *)CONCAT44(extraout_var,iVar2);
    local_48._32_8_ = this;
    pMVar3 = MapValueRef::GetMessageValue(this);
    (**(code **)((long)this->data_ + 0x80))(this,pMVar3);
    Reflection::SetAllocatedMessage
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
               (Message *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  return;
}

Assistant:

void MapFieldPrinterHelper::CopyValue(const MapValueRef& value,
                                      Message* message,
                                      const FieldDescriptor* field_desc) {
  const Reflection* reflection = message->GetReflection();
  switch (field_desc->cpp_type()) {
    case FieldDescriptor::CPPTYPE_DOUBLE:
      reflection->SetDouble(message, field_desc, value.GetDoubleValue());
      return;
    case FieldDescriptor::CPPTYPE_FLOAT:
      reflection->SetFloat(message, field_desc, value.GetFloatValue());
      return;
    case FieldDescriptor::CPPTYPE_ENUM:
      reflection->SetEnumValue(message, field_desc, value.GetEnumValue());
      return;
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      Message* sub_message = value.GetMessageValue().New();
      sub_message->CopyFrom(value.GetMessageValue());
      reflection->SetAllocatedMessage(message, sub_message, field_desc);
      return;
    }
    case FieldDescriptor::CPPTYPE_STRING:
      reflection->SetString(message, field_desc, value.GetStringValue());
      return;
    case FieldDescriptor::CPPTYPE_INT64:
      reflection->SetInt64(message, field_desc, value.GetInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_INT32:
      reflection->SetInt32(message, field_desc, value.GetInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT64:
      reflection->SetUInt64(message, field_desc, value.GetUInt64Value());
      return;
    case FieldDescriptor::CPPTYPE_UINT32:
      reflection->SetUInt32(message, field_desc, value.GetUInt32Value());
      return;
    case FieldDescriptor::CPPTYPE_BOOL:
      reflection->SetBool(message, field_desc, value.GetBoolValue());
      return;
  }
}